

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::visitImportedFunction(PrintSExpression *this,Function *curr)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar1 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  this->currFunction = curr;
  if ((this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  }
  local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  emitImportHeader(this,&curr->super_Importable);
  handleSignature(this,curr,false);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"))",2);
  poVar1 = this->o;
  __s = this->maybeNewLine;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  return;
}

Assistant:

void PrintSExpression::visitImportedFunction(Function* curr) {
  doIndent(o, indent);
  currFunction = curr;
  lastPrintedLocation = std::nullopt;
  o << '(';
  emitImportHeader(curr);
  handleSignature(curr);
  o << "))";
  o << maybeNewLine;
}